

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int mbedtls_base64_encode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  uchar *puVar5;
  uint uVar6;
  uchar uVar7;
  ulong uVar8;
  
  if (slen == 0) {
    *olen = 0;
    return 0;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = slen;
  uVar8 = (ulong)(0x5555555555555555 < SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),0)) + slen / 3;
  if (uVar8 >> 0x3e == 0) {
    uVar8 = uVar8 * 4;
    if (uVar8 < dlen) {
      puVar5 = dst;
      if (slen < 3) {
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        do {
          bVar3 = src[uVar8];
          bVar1 = src[uVar8 + 1];
          bVar2 = src[uVar8 + 2];
          *puVar5 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 >> 2];
          puVar5[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [(bVar3 & 3) << 4 | (uint)(bVar1 >> 4)];
          puVar5[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [(uint)(bVar2 >> 6) + (bVar1 & 0xf) * 4];
          puVar5[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [bVar2 & 0x3f];
          puVar5 = puVar5 + 4;
          uVar8 = uVar8 + 3;
        } while (uVar8 < (slen / 3) * 3);
        src = src + uVar8;
      }
      if (uVar8 < slen) {
        bVar3 = *src;
        uVar6 = 0;
        if (uVar8 + 1 < slen) {
          uVar6 = (uint)src[1];
        }
        *puVar5 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 >> 2];
        puVar5[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(bVar3 & 3) << 4 | uVar6 >> 4];
        uVar7 = '=';
        if (uVar8 + 1 < slen) {
          uVar7 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(ulong)(uVar6 & 0xf) * 4];
        }
        puVar5[2] = uVar7;
        puVar5[3] = '=';
        puVar5 = puVar5 + 4;
      }
      *olen = (long)puVar5 - (long)dst;
      *puVar5 = '\0';
      return 0;
    }
    *olen = uVar8 | 1;
  }
  else {
    *olen = 0xffffffffffffffff;
  }
  return -0x2a;
}

Assistant:

int mbedtls_base64_encode( unsigned char *dst, size_t dlen, size_t *olen,
                   const unsigned char *src, size_t slen )
{
    size_t i, n;
    int C1, C2, C3;
    unsigned char *p;

    if( slen == 0 )
    {
        *olen = 0;
        return( 0 );
    }

    n = slen / 3 + ( slen % 3 != 0 );

    if( n > ( BASE64_SIZE_T_MAX - 1 ) / 4 )
    {
        *olen = BASE64_SIZE_T_MAX;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

    n *= 4;

    if( dlen < n + 1 )
    {
        *olen = n + 1;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

    n = ( slen / 3 ) * 3;

    for( i = 0, p = dst; i < n; i += 3 )
    {
        C1 = *src++;
        C2 = *src++;
        C3 = *src++;

        *p++ = base64_enc_map[(C1 >> 2) & 0x3F];
        *p++ = base64_enc_map[(((C1 &  3) << 4) + (C2 >> 4)) & 0x3F];
        *p++ = base64_enc_map[(((C2 & 15) << 2) + (C3 >> 6)) & 0x3F];
        *p++ = base64_enc_map[C3 & 0x3F];
    }

    if( i < slen )
    {
        C1 = *src++;
        C2 = ( ( i + 1 ) < slen ) ? *src++ : 0;

        *p++ = base64_enc_map[(C1 >> 2) & 0x3F];
        *p++ = base64_enc_map[(((C1 & 3) << 4) + (C2 >> 4)) & 0x3F];

        if( ( i + 1 ) < slen )
             *p++ = base64_enc_map[((C2 & 15) << 2) & 0x3F];
        else *p++ = '=';

        *p++ = '=';
    }

    *olen = p - dst;
    *p = 0;

    return( 0 );
}